

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamHttp::Close(BamHttp *this)

{
  BamHttp *in_RDI;
  
  DisconnectSocket(in_RDI);
  in_RDI->m_isUrlParsed = false;
  in_RDI->m_filePosition = -1;
  in_RDI->m_fileEndPosition = -1;
  in_RDI->m_rangeEndPosition = -1;
  (in_RDI->super_IBamIODevice).m_mode = NotOpen;
  return;
}

Assistant:

void BamHttp::Close()
{

    // disconnect socket & clear related resources
    DisconnectSocket();

    // reset state
    m_isUrlParsed = false;
    m_filePosition = -1;
    m_fileEndPosition = -1;
    m_rangeEndPosition = -1;
    m_mode = IBamIODevice::NotOpen;
}